

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupMockPlugin::TEST_GROUP_CppUTestGroupMockPlugin
          (TEST_GROUP_CppUTestGroupMockPlugin *this)

{
  SimpleString local_30 [2];
  TEST_GROUP_CppUTestGroupMockPlugin *local_10;
  TEST_GROUP_CppUTestGroupMockPlugin *this_local;
  
  local_10 = this;
  Utest::Utest(&this->super_Utest);
  (this->super_Utest)._vptr_Utest = (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMockPlugin_0034ac08;
  StringBufferTestOutput::StringBufferTestOutput(&this->output);
  SimpleString::SimpleString(local_30,"MockSupportPLugin");
  MockSupportPlugin::MockSupportPlugin(&this->plugin,local_30);
  SimpleString::~SimpleString(local_30);
  return;
}

Assistant:

TEST_GROUP(MockPlugin)
{
    StringBufferTestOutput output;

    UtestShell *test;
    TestResult *result;

    MockSupportPlugin plugin;

    void setup() _override
    {
        test = new UtestShell("group", "name", "file", 1);
        result = new TestResult(output);
    }

    void teardown() _override
    {
        delete test;
        delete result;
        mock().clear();
        mock().removeAllComparatorsAndCopiers();
    }
}